

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# se.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *ip_00;
  int port_00;
  int device_00;
  int quality_00;
  int quality;
  int device;
  int port;
  char *ip;
  char **argv_local;
  int argc_local;
  
  ip_00 = argv[1];
  port_00 = atoi(argv[2]);
  device_00 = atoi(argv[3]);
  quality_00 = atoi(argv[4]);
  camera_fun(ip_00,port_00,device_00,quality_00);
  return 0;
}

Assistant:

int main(int argc,char **argv)
{
	char *ip=argv[1];
	int port = atoi(argv[2]);
	int device = atoi(argv[3]);
	int quality = atoi(argv[4]);
	 
	camera_fun(ip,port,device,quality);

    return 0;
}